

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

errr grab_effect_data(parser *p,effect *effect)

{
  _Bool _Var1;
  errr eVar2;
  wchar_t wVar3;
  char *pcVar4;
  wchar_t val;
  wchar_t local_1c;
  
  pcVar4 = parser_getsym(p,"eff");
  eVar2 = grab_name("effect",pcVar4,effect_list,0x72,&local_1c);
  if (eVar2 != 0) {
    return 9;
  }
  effect->index = (uint16_t)local_1c;
  _Var1 = parser_hasval(p,"type");
  if (_Var1) {
    pcVar4 = parser_getsym(p,"type");
    if (pcVar4 == (char *)0x0) {
      return 0x3d;
    }
    local_1c = effect_subtype((uint)effect->index,pcVar4);
    if (local_1c < L'\0') {
      return 0x1e;
    }
    effect->subtype = local_1c;
  }
  _Var1 = parser_hasval(p,"radius");
  if (_Var1) {
    wVar3 = parser_getint(p,"radius");
    effect->radius = wVar3;
  }
  _Var1 = parser_hasval(p,"other");
  if (_Var1) {
    wVar3 = parser_getint(p,"other");
    effect->other = wVar3;
  }
  return 0;
}

Assistant:

errr grab_effect_data(struct parser *p, struct effect *effect)
{
	const char *type;
	int val;

	if (grab_name("effect", parser_getsym(p, "eff"), effect_list,
				  N_ELEMENTS(effect_list), &val))
		return PARSE_ERROR_INVALID_EFFECT;
	effect->index = val;

	if (parser_hasval(p, "type")) {
		type = parser_getsym(p, "type");

		if (type == NULL)
			return PARSE_ERROR_UNRECOGNISED_PARAMETER;

		/* Check for a value */
		val = effect_subtype(effect->index, type);
		if (val < 0)
			return PARSE_ERROR_INVALID_VALUE;
		else
			effect->subtype = val;
	}

	if (parser_hasval(p, "radius"))
		effect->radius = parser_getint(p, "radius");

	if (parser_hasval(p, "other"))
		effect->other = parser_getint(p, "other");

	return PARSE_ERROR_NONE;
}